

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EratBig.cpp
# Opt level: O1

void __thiscall
primesieve::EratBig::crossOff
          (EratBig *this,Vector<unsigned_char,_std::allocator<unsigned_char>_> *sieve)

{
  SievingPrime **__dest;
  SievingPrime *pSVar1;
  Bucket *pBVar2;
  size_t __n;
  Bucket *bucket;
  
  __dest = (this->buckets_).array_;
  pSVar1 = *__dest;
  while (pSVar1 != (SievingPrime *)0x0) {
    bucket = (Bucket *)((ulong)((long)&pSVar1[-1].sievingPrime_ + 3U) & 0xffffffffffffe000);
    bucket->end_ = pSVar1;
    *__dest = (SievingPrime *)0x0;
    do {
      crossOff(this,sieve->array_,bucket->sievingPrimes_,bucket->end_);
      pBVar2 = bucket->next_;
      MemoryPool::freeBucket(this->memoryPool_,bucket);
      bucket = pBVar2;
    } while (pBVar2 != (Bucket *)0x0);
    __dest = (this->buckets_).array_;
    pSVar1 = *__dest;
  }
  __n = (long)(this->buckets_).end_ - (long)(__dest + 1);
  if (__n != 0) {
    memmove(__dest,__dest + 1,__n);
  }
  (this->buckets_).end_[-1] = (SievingPrime *)0x0;
  return;
}

Assistant:

void EratBig::crossOff(Vector<uint8_t>& sieve)
{
  while (buckets_[0])
  {
    Bucket* bucket = Bucket::get(buckets_[0]);
    bucket->setEnd(buckets_[0]);
    buckets_[0] = nullptr;

    // Iterate over the buckets related
    // to the current segment.
    while (bucket)
    {
      crossOff(sieve.data(), bucket->begin(), bucket->end());
      Bucket* processed = bucket;
      bucket = bucket->next();
      memoryPool_->freeBucket(processed);
    }
  }

  // Move the bucket related to the next segment
  // to the 1st position so that it will be used
  // when sieving the next segment.
  auto* bucket = buckets_[0];
  std::copy(buckets_.begin() + 1, buckets_.end(), buckets_.begin());
  buckets_.back() = bucket;
}